

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O2

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::RemoveStateFactor
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,Index sf)

{
  TwoStageDynamicBayesianNetwork *this_00;
  MADPComponentFactoredStates *this_01;
  value_type pCVar1;
  bool bVar2;
  int iVar3;
  size_type __n;
  ulong uVar4;
  CPDDiscreteInterface *pCVar5;
  undefined4 extraout_var;
  ulong uVar6;
  unsigned_long uVar7;
  undefined4 extraout_var_00;
  size_t X;
  CPT *this_02;
  reference ppCVar8;
  Index IVar9;
  ulong uVar10;
  size_t Y;
  long lVar11;
  uint uVar12;
  size_t j;
  size_t i;
  ulong uVar13;
  ulong local_2b0;
  Scope YSc;
  Scope sc;
  Scope XSc_1;
  Scope XSc_i_sf;
  vector<Scope,_std::allocator<Scope>_> XSoIY;
  Scope YSc_1;
  Scope YScI_r;
  vector<Scope,_std::allocator<Scope>_> YSoIY;
  vector<Scope,_std::allocator<Scope>_> ASoIY;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> Y_cpts;
  Scope ASc_i_sf;
  Scope XSc;
  vector<Scope,_std::allocator<Scope>_> OSoIO;
  vector<Scope,_std::allocator<Scope>_> YSoIO;
  vector<Scope,_std::allocator<Scope>_> ASoIO;
  vector<Scope,_std::allocator<Scope>_> XSoIO;
  vector<unsigned_long,_std::allocator<unsigned_long>_> size_YScI_r;
  vector<unsigned_long,_std::allocator<unsigned_long>_> size_ASc_i_sf;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> O_cpts;
  Scope sc_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> size_XSc_i_sf;
  Scope XScSf;
  
  uVar13 = (ulong)sf;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&XScSf.super_SDT,
             &(this->_m_2dbn)._m_XSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13].super_SDT);
  Y_cpts.super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Y_cpts.super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  Y_cpts.super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
  std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::vector
            (&O_cpts,__n,(allocator_type *)&XSoIY);
  XSoIY.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ASoIY.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  YSoIY.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = &this->_m_2dbn;
  uVar10 = 0;
  ASoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ASoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  ASoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  XSoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  YSoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  XSoIY.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  XSoIY.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  ASoIY.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ASoIY.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  YSoIY.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  YSoIY.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  XSoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  XSoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  YSoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  YSoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  OSoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  OSoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  OSoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  while( true ) {
    uVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
    if (uVar4 <= uVar10) break;
    pCVar5 = TwoStageDynamicBayesianNetwork::GetCPD_O(this_00,(Index)uVar10);
    iVar3 = (*pCVar5->_vptr_CPDDiscreteInterface[6])(pCVar5);
    O_cpts.super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar10] =
         (CPDDiscreteInterface *)CONCAT44(extraout_var,iVar3);
    uVar4 = uVar10 & 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&XSc,
               &(this->_m_2dbn)._m_XSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4].super_SDT);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&YSc,
               &(this->_m_2dbn)._m_YSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4].super_SDT);
    IVar9 = sf;
    while( true ) {
      uVar6 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
      uVar12 = IVar9 + 1;
      if (uVar6 <= uVar12) break;
      sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Scope::Insert(&sc,uVar12);
      bVar2 = Scope::Contains(&XSc,uVar12);
      if (bVar2) {
        Scope::Remove(&XSc,&sc);
        Scope::Insert(&XSc,IVar9);
      }
      bVar2 = Scope::Contains(&YSc,uVar12);
      if (bVar2) {
        Scope::Remove(&YSc,&sc);
        Scope::Insert(&YSc,IVar9);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&sc);
      IVar9 = uVar12;
    }
    std::vector<Scope,_std::allocator<Scope>_>::push_back(&XSoIO,(value_type *)&XSc);
    std::vector<Scope,_std::allocator<Scope>_>::push_back
              (&ASoIO,(this->_m_2dbn)._m_ASoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar4);
    std::vector<Scope,_std::allocator<Scope>_>::push_back(&YSoIO,(value_type *)&YSc);
    std::vector<Scope,_std::allocator<Scope>_>::push_back
              (&OSoIO,(this->_m_2dbn)._m_OSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar4);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&YSc);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&XSc);
    uVar10 = uVar10 + 1;
  }
  local_2b0 = 0;
  while( true ) {
    uVar10 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
    if (uVar10 <= local_2b0) break;
    if (local_2b0 != uVar13) {
      uVar10 = local_2b0 & 0xffffffff;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&XSc.super_SDT,
                 &(this->_m_2dbn)._m_YSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar10].super_SDT);
      bVar2 = Scope::Contains(&XSc,sf);
      if (bVar2) {
        YSc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        YSc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        YSc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        Scope::Insert(&YSc,sf);
        sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        sc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        Scope::Insert(&sc,(Index)local_2b0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&XSc_i_sf,
                   &(this->_m_2dbn)._m_XSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar10].super_SDT);
        Scope::Insert(&XSc_i_sf,&XScSf);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&ASc_i_sf.super_SDT,
                   &(this->_m_2dbn)._m_ASoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar10].super_SDT);
        Scope::Insert(&ASc_i_sf,
                      (this->_m_2dbn)._m_ASoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar13);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&YScI_r.super_SDT,&XSc.super_SDT);
        Scope::Remove(&YScI_r,&YSc);
        size_ASc_i_sf.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&size_XSc_i_sf,
                   (long)XSc_i_sf.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)XSc_i_sf.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2,
                   (value_type_conflict2 *)&size_ASc_i_sf,(allocator_type *)&size_YScI_r);
        size_YScI_r.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&size_ASc_i_sf,
                   (long)ASc_i_sf.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)ASc_i_sf.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)&size_YScI_r,
                   (allocator_type *)&XSc_1);
        XSc_1.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&size_YScI_r,
                   (long)YScI_r.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)YScI_r.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)&XSc_1,
                   (allocator_type *)&YSc_1);
        Y = 1;
        uVar10 = 0;
        while( true ) {
          if ((ulong)((long)XSc_i_sf.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)XSc_i_sf.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) <= uVar10) break;
          uVar7 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xc0))
                            (this,XSc_i_sf.super_SDT.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar10]);
          Y = Y * uVar7;
          size_XSc_i_sf.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = uVar7;
          uVar10 = uVar10 + 1;
        }
        uVar10 = 0;
        while( true ) {
          if ((ulong)((long)ASc_i_sf.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)ASc_i_sf.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) <= uVar10) break;
          uVar7 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x108))
                            (this,ASc_i_sf.super_SDT.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar10]);
          Y = Y * uVar7;
          size_ASc_i_sf.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = uVar7;
          uVar10 = uVar10 + 1;
        }
        uVar10 = 0;
        while( true ) {
          if ((ulong)((long)YScI_r.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)YScI_r.super_SDT.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) <= uVar10) break;
          uVar7 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xc0))
                            (this,YScI_r.super_SDT.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar10]);
          Y = Y * uVar7;
          size_YScI_r.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = uVar7;
          uVar10 = uVar10 + 1;
        }
        X = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xc0))(this,local_2b0);
        this_02 = (CPT *)operator_new(0x30);
        CPT::CPT(this_02,X,Y);
        XSc_1.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)this_02;
        std::vector<CPDDiscreteInterface*,std::allocator<CPDDiscreteInterface*>>::
        emplace_back<CPDDiscreteInterface*>
                  ((vector<CPDDiscreteInterface*,std::allocator<CPDDiscreteInterface*>> *)&Y_cpts,
                   (CPDDiscreteInterface **)&XSc_1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&XSc_1.super_SDT,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&XSc_i_sf
                  );
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&YSc_1.super_SDT,&YScI_r.super_SDT);
        IVar9 = sf;
        while( true ) {
          uVar10 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
          uVar12 = IVar9 + 1;
          if (uVar10 <= uVar12) break;
          sc_1.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          sc_1.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          sc_1.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          Scope::Insert(&sc_1,uVar12);
          bVar2 = Scope::Contains(&XSc_1,uVar12);
          if (bVar2) {
            Scope::Remove(&XSc_1,&sc_1);
            Scope::Insert(&XSc_1,IVar9);
          }
          bVar2 = Scope::Contains(&YSc_1,uVar12);
          if (bVar2) {
            Scope::Remove(&YSc_1,&sc_1);
            Scope::Insert(&YSc_1,IVar9);
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&sc_1);
          IVar9 = uVar12;
        }
        std::vector<Scope,_std::allocator<Scope>_>::push_back(&XSoIY,&XSc_1);
        std::vector<Scope,_std::allocator<Scope>_>::push_back(&ASoIY,(value_type *)&ASc_i_sf);
        std::vector<Scope,_std::allocator<Scope>_>::push_back(&YSoIY,&YSc_1);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&YSc_1);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&XSc_1);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&size_YScI_r.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&size_ASc_i_sf.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
        ;
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&size_XSc_i_sf.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
        ;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&YScI_r);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&ASc_i_sf);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&XSc_i_sf);
      }
      else {
        pCVar5 = TwoStageDynamicBayesianNetwork::GetCPD_Y(this_00,(Index)local_2b0);
        iVar3 = (*pCVar5->_vptr_CPDDiscreteInterface[6])(pCVar5);
        YSc.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar3);
        std::vector<CPDDiscreteInterface*,std::allocator<CPDDiscreteInterface*>>::
        emplace_back<CPDDiscreteInterface*>
                  ((vector<CPDDiscreteInterface*,std::allocator<CPDDiscreteInterface*>> *)&Y_cpts,
                   (CPDDiscreteInterface **)&YSc);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&YSc.super_SDT,
                   &(this->_m_2dbn)._m_XSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar10].super_SDT);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&sc.super_SDT,
                   &(this->_m_2dbn)._m_YSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar10].super_SDT);
        IVar9 = sf;
        while( true ) {
          uVar4 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
          uVar12 = IVar9 + 1;
          if (uVar4 <= uVar12) break;
          XSc_i_sf.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          XSc_i_sf.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          XSc_i_sf.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          Scope::Insert(&XSc_i_sf,uVar12);
          bVar2 = Scope::Contains(&YSc,uVar12);
          if (bVar2) {
            Scope::Remove(&YSc,&XSc_i_sf);
            Scope::Insert(&YSc,IVar9);
          }
          bVar2 = Scope::Contains(&sc,uVar12);
          if (bVar2) {
            Scope::Remove(&sc,&XSc_i_sf);
            Scope::Insert(&sc,IVar9);
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&XSc_i_sf);
          IVar9 = uVar12;
        }
        std::vector<Scope,_std::allocator<Scope>_>::push_back(&XSoIY,&YSc);
        std::vector<Scope,_std::allocator<Scope>_>::push_back
                  (&ASoIY,(this->_m_2dbn)._m_ASoI_Y.
                          super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar10);
        std::vector<Scope,_std::allocator<Scope>_>::push_back(&YSoIY,&sc);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&sc);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&YSc);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&XSc);
    }
    local_2b0 = local_2b0 + 1;
  }
  this_01 = &this->_m_S;
  MADPComponentFactoredStates::RemoveStateFactor(this_01,sf);
  MADPComponentFactoredStates::SetInitialized(this_01,false);
  MADPComponentFactoredStates::SetInitialized(this_01,true);
  TwoStageDynamicBayesianNetwork::InitializeStorage(this_00);
  lVar11 = 0;
  uVar13 = 0;
  while( true ) {
    uVar10 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
    if (uVar10 <= uVar13) break;
    TwoStageDynamicBayesianNetwork::SetSoI_O
              (this_00,(Index)uVar13,
               (Scope *)((long)&((XSoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                                  super__Vector_impl_data._M_start)->super_SDT).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar11),
               (Scope *)((long)&((ASoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                                  super__Vector_impl_data._M_start)->super_SDT).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar11),
               (Scope *)((long)&((YSoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                                  super__Vector_impl_data._M_start)->super_SDT).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar11),
               (Scope *)((long)&((OSoIO.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                                  super__Vector_impl_data._M_start)->super_SDT).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar11));
    pCVar1 = O_cpts.
             super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar13];
    ppCVar8 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                        (&(this->_m_2dbn)._m_O_CPDs,uVar13 & 0xffffffff);
    *ppCVar8 = pCVar1;
    uVar13 = uVar13 + 1;
    lVar11 = lVar11 + 0x18;
  }
  lVar11 = 0;
  uVar13 = 0;
  while( true ) {
    uVar10 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
    if (uVar10 <= uVar13) break;
    TwoStageDynamicBayesianNetwork::SetSoI_Y
              (this_00,(Index)uVar13,
               (Scope *)((long)&((XSoIY.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                                  super__Vector_impl_data._M_start)->super_SDT).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar11),
               (Scope *)((long)&((ASoIY.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                                  super__Vector_impl_data._M_start)->super_SDT).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar11),
               (Scope *)((long)&((YSoIY.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                                  super__Vector_impl_data._M_start)->super_SDT).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar11));
    pCVar1 = Y_cpts.
             super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar13];
    ppCVar8 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                        (&(this->_m_2dbn)._m_Y_CPDs,uVar13 & 0xffffffff);
    *ppCVar8 = pCVar1;
    uVar13 = uVar13 + 1;
    lVar11 = lVar11 + 0x18;
  }
  TwoStageDynamicBayesianNetwork::InitializeIIs(this_00);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&OSoIO);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&YSoIO);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&ASoIO);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&XSoIO);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&YSoIY);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&ASoIY);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&XSoIY);
  std::_Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::~_Vector_base
            (&O_cpts.
              super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>);
  std::_Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::~_Vector_base
            (&Y_cpts.
              super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&XScSf);
  return;
}

Assistant:

void MultiAgentDecisionProcessDiscreteFactoredStates::RemoveStateFactor(Index sf)
{
    Scope XScSf = _m_2dbn.GetXSoI_Y(sf);
    vector<CPDDiscreteInterface*> Y_cpts;
    vector<CPDDiscreteInterface*> O_cpts(GetNrAgents());
    vector<Scope> XSoIY, ASoIY, YSoIY;
    vector<Scope> XSoIO, ASoIO, YSoIO, OSoIO;

    for(size_t i = 0; i < GetNrAgents(); i++)
    {
        O_cpts[i] = _m_2dbn.GetCPD_O(i)->Clone();
        Scope XSc(_m_2dbn.GetXSoI_O(i)), YSc(_m_2dbn.GetYSoI_O(i));
        for(Index x = sf+1; x < GetNrStateFactors(); x++){
            //This corrects the scope indices, which will be changed after removing sf
            Scope sc;
            sc.Insert(x);
            if(XSc.Contains(x)){
                XSc.Remove(sc);
                XSc.Insert(x-1);
            }
            if(YSc.Contains(x)){
                YSc.Remove(sc);
                YSc.Insert(x-1);
            }
        }
        XSoIO.push_back(XSc);
        ASoIO.push_back(_m_2dbn.GetASoI_O(i));
        YSoIO.push_back(YSc);
        OSoIO.push_back(_m_2dbn.GetOSoI_O(i));
    }

    for(size_t i = 0; i < GetNrStateFactors(); i++)
    {
        if(i == sf)
            continue;    
        Scope YScI = _m_2dbn.GetYSoI_Y(i);
        if(YScI.Contains(sf))
        {
            Scope sfSc;
            sfSc.Insert(sf);
            Scope iSc;
            iSc.Insert(i);
            Scope XSc_i_sf = _m_2dbn.GetXSoI_Y(i);
            XSc_i_sf.Insert(XScSf);
            Scope ASc_i_sf = _m_2dbn.GetASoI_Y(i);
            ASc_i_sf.Insert(_m_2dbn.GetASoI_Y(sf));
            Scope YScI_r(YScI);
            YScI_r.Remove(sfSc);

            size_t ii_size = 1;
            vector<size_t> size_XSc_i_sf(XSc_i_sf.size(),0);
            vector<size_t> size_ASc_i_sf(ASc_i_sf.size(),0);
            vector<size_t> size_YScI_r(YScI_r.size(),0);
            for(size_t j = 0; j < XSc_i_sf.size(); j++){
                size_XSc_i_sf[j] = GetNrValuesForFactor(XSc_i_sf[j]);
                ii_size *= size_XSc_i_sf[j];
            }
            for(size_t j = 0; j < ASc_i_sf.size(); j++){
                size_ASc_i_sf[j] = GetNrActions(ASc_i_sf[j]);
                ii_size *= size_ASc_i_sf[j];
            }
            for(size_t j = 0; j < YScI_r.size(); j++){
                size_YScI_r[j] = GetNrValuesForFactor(YScI_r[j]);
                ii_size *= size_YScI_r[j];
            }
            size_t nrVals_i = GetNrValuesForFactor(i);
            CPT* cpt = new CPT(nrVals_i, ii_size);

            //NOTE: This already fixes the scopes and CPT sizes in the DBN, but it does not yet marginalize
            //each CPT. This will be necessary for factored event-driven algorithms.

            Y_cpts.push_back(cpt);
            Scope XSc(XSc_i_sf), YSc(YScI_r);
            for(Index x = sf+1; x < GetNrStateFactors(); x++){
                Scope sc;
                sc.Insert(x);
                if(XSc.Contains(x)){
                    XSc.Remove(sc);
                    XSc.Insert(x-1);
                }
                if(YSc.Contains(x)){
                    YSc.Remove(sc);
                    YSc.Insert(x-1);
                }
            }
            XSoIY.push_back(XSc);
            ASoIY.push_back(ASc_i_sf);
            YSoIY.push_back(YSc);
        }
        else
        {
            Y_cpts.push_back(_m_2dbn.GetCPD_Y(i)->Clone());
            Scope XSc(_m_2dbn.GetXSoI_Y(i)), YSc(_m_2dbn.GetYSoI_Y(i));
            for(Index x = sf+1; x < GetNrStateFactors(); x++){
                Scope sc;
                sc.Insert(x);
                if(XSc.Contains(x)){
                    XSc.Remove(sc);
                    XSc.Insert(x-1);
                }
                if(YSc.Contains(x)){
                    YSc.Remove(sc);
                    YSc.Insert(x-1);
                }
            }
            XSoIY.push_back(XSc);
            ASoIY.push_back(_m_2dbn.GetASoI_Y(i));
            YSoIY.push_back(YSc);
        }
    }

    _m_S.RemoveStateFactor(sf);
    _m_S.SetInitialized(false);
    _m_S.SetInitialized(true);

    //now we need to fix the DBN
    _m_2dbn.InitializeStorage();
    for(size_t i = 0; i < GetNrAgents(); i++)
    {
        _m_2dbn.SetSoI_O(i, XSoIO[i], ASoIO[i], YSoIO[i], OSoIO[i]);
        _m_2dbn.SetCPD_O(i, O_cpts[i]);
    }
    for(size_t i = 0; i < GetNrStateFactors(); i++)
    {
        _m_2dbn.SetSoI_Y(i, XSoIY[i], ASoIY[i], YSoIY[i]);
        _m_2dbn.SetCPD_Y(i, Y_cpts[i]);
    }
    _m_2dbn.InitializeIIs();
}